

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void __thiscall
BaseIndex::ChainStateFlushed(BaseIndex *this,ChainstateRole role,CBlockLocator *locator)

{
  uint256 *puVar1;
  CBlockIndex *this_00;
  string_view source_file;
  bool bVar2;
  CBlockIndex *pCVar3;
  CBlockIndex *pCVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  string local_108;
  string local_e8 [4];
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((role == ASSUMEDVALID) || (((this->m_synced)._M_base._M_i & 1U) == 0)) goto LAB_0048e694;
  puVar1 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48._M_dataplus._M_p = (pointer)&cs_main;
  local_48._M_string_length = local_48._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_48);
  pCVar3 = ::node::BlockManager::LookupBlockIndex(this->m_chainstate->m_blockman,puVar1);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_48);
  if (pCVar3 == (CBlockIndex *)0x0) {
    base_blob<256u>::ToString_abi_cxx11_(&local_48,puVar1);
    FatalErrorf<char[18],std::__cxx11::string>
              (this,"%s: First block (hash=%s) in locator was not found",
               (char (*) [18])"ChainStateFlushed",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0048e694;
    local_e8[0].field_2._0_8_ =
         CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
    local_e8[0]._M_dataplus._M_p = local_48._M_dataplus._M_p;
  }
  else {
    this_00 = (this->m_best_block_index)._M_b._M_p;
    pCVar4 = CBlockIndex::GetAncestor(this_00,pCVar3->nHeight);
    if (pCVar4 == pCVar3) {
      Commit(this);
      goto LAB_0048e694;
    }
    base_blob<256u>::ToString_abi_cxx11_(local_e8,puVar1);
    puVar1 = this_00->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_128 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    uStack_120 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_118 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_110 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::ToString_abi_cxx11_(&local_108,&local_128);
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      tinyformat::format<char[18],std::__cxx11::string,std::__cxx11::string>
                (&local_68,
                 (tinyformat *)
                 "%s: WARNING: Locator contains block (hash=%s) not on known best chain (tip=%s); not writing index locator\n"
                 ,"ChainStateFlushed",(char (*) [18])local_e8,&local_108,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x57;
      local_68._M_string_length = 0x855b83;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = local_48._M_dataplus._M_p;
      str._M_len = local_48._M_string_length;
      logging_function._M_str = "ChainStateFlushed";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x16a,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p == &local_e8[0].field_2) goto LAB_0048e694;
  }
  operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._0_8_ + 1);
LAB_0048e694:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::ChainStateFlushed(ChainstateRole role, const CBlockLocator& locator)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    if (!m_synced) {
        return;
    }

    const uint256& locator_tip_hash = locator.vHave.front();
    const CBlockIndex* locator_tip_index;
    {
        LOCK(cs_main);
        locator_tip_index = m_chainstate->m_blockman.LookupBlockIndex(locator_tip_hash);
    }

    if (!locator_tip_index) {
        FatalErrorf("%s: First block (hash=%s) in locator was not found",
                   __func__, locator_tip_hash.ToString());
        return;
    }

    // This checks that ChainStateFlushed callbacks are received after BlockConnected. The check may fail
    // immediately after the sync thread catches up and sets m_synced. Consider the case where
    // there is a reorg and the blocks on the stale branch are in the ValidationInterface queue
    // backlog even after the sync thread has caught up to the new chain tip. In this unlikely
    // event, log a warning and let the queue clear.
    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (best_block_index->GetAncestor(locator_tip_index->nHeight) != locator_tip_index) {
        LogPrintf("%s: WARNING: Locator contains block (hash=%s) not on known best "
                  "chain (tip=%s); not writing index locator\n",
                  __func__, locator_tip_hash.ToString(),
                  best_block_index->GetBlockHash().ToString());
        return;
    }

    // No need to handle errors in Commit. If it fails, the error will be already be logged. The
    // best way to recover is to continue, as index cannot be corrupted by a missed commit to disk
    // for an advanced index state.
    Commit();
}